

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

uint64_t __thiscall
Imf_3_3::IDManifest::ChannelGroupManifest::insert(ChannelGroupManifest *this,string *text)

{
  __type _Var1;
  uint uVar2;
  stringstream *text_00;
  string *in_RDI;
  stringstream _iex_throw_s;
  string *in_stack_00000068;
  uint64_t in_stack_00000070;
  ChannelGroupManifest *in_stack_00000078;
  uint64_t hash;
  string *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  ostream local_190 [376];
  ulong local_18;
  
  _Var1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if (_Var1) {
    uVar2 = MurmurHash32(in_RDI);
    local_18 = (ulong)uVar2;
  }
  else {
    _Var1 = std::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (!_Var1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe60);
      std::operator<<(local_190,"Cannot compute hash: unknown hashing scheme");
      text_00 = (stringstream *)__cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc((ArgExc *)in_RDI,text_00);
      __cxa_throw(text_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
    local_18 = MurmurHash64(in_stack_fffffffffffffe50);
  }
  insert(in_stack_00000078,in_stack_00000070,in_stack_00000068);
  return local_18;
}

Assistant:

uint64_t
IDManifest::ChannelGroupManifest::insert (const std::string& text)
{
    uint64_t hash;
    if (_hashScheme == MURMURHASH3_32) { hash = MurmurHash32 (text); }
    else if (_hashScheme == MURMURHASH3_64) { hash = MurmurHash64 (text); }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot compute hash: unknown hashing scheme");
    }
    insert (hash, text);
    return hash;
}